

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

void __thiscall
Omega_h::Write<double>::Write(Write<double> *this,LO size_in,double value,string *name_in)

{
  int *piVar1;
  Alloc *pAVar2;
  Write<double> local_28;
  double local_18;
  
  local_18 = value;
  Write(this,size_in,name_in);
  local_28.shared_alloc_.alloc = (this->shared_alloc_).alloc;
  if (((ulong)local_28.shared_alloc_.alloc & 7) == 0 && local_28.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_28.shared_alloc_.alloc = (Alloc *)((local_28.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_28.shared_alloc_.alloc)->use_count = (local_28.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_28.shared_alloc_.direct_ptr = (this->shared_alloc_).direct_ptr;
  fill<double>(&local_28,local_18);
  pAVar2 = local_28.shared_alloc_.alloc;
  if (((ulong)local_28.shared_alloc_.alloc & 7) == 0 && local_28.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_28.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_28.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  return;
}

Assistant:

Write<T>::Write(LO size_in, T value, std::string const& name_in)
    : Write<T>(size_in, name_in) {
  fill(*this, value);
}